

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O0

void __thiscall Constructor::printBody(Constructor *this,ostream *s,ParserWalker *walker)

{
  const_reference ppOVar1;
  TripleSymbol *pTVar2;
  Constructor *this_00;
  size_type sVar3;
  const_reference pvVar4;
  char *pcVar5;
  long local_48;
  int local_2c;
  int4 index;
  int4 i;
  SubtableSymbol *sym;
  ParserWalker *walker_local;
  ostream *s_local;
  Constructor *this_local;
  
  if (this->flowthruindex != -1) {
    ppOVar1 = std::vector<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>::operator[]
                        (&this->operands,(long)this->flowthruindex);
    pTVar2 = OperandSymbol::getDefiningSymbol(*ppOVar1);
    if (pTVar2 == (TripleSymbol *)0x0) {
      local_48 = 0;
    }
    else {
      local_48 = __dynamic_cast(pTVar2,&TripleSymbol::typeinfo,&SubtableSymbol::typeinfo,0);
    }
    if (local_48 != 0) {
      ParserWalker::pushOperand(walker,this->flowthruindex);
      this_00 = ParserWalker::getConstructor(walker);
      printBody(this_00,s,walker);
      ParserWalker::popOperand(walker);
      return;
    }
  }
  if (this->firstwhitespace != -1) {
    local_2c = this->firstwhitespace;
    while( true ) {
      local_2c = local_2c + 1;
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->printpiece);
      if (sVar3 <= (ulong)(long)local_2c) break;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->printpiece,(long)local_2c);
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)pvVar4);
      if (*pcVar5 == '\n') {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->printpiece,(long)local_2c);
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)pvVar4);
        ppOVar1 = std::vector<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>::operator[]
                            (&this->operands,(long)(*pcVar5 + -0x41));
        (*((*ppOVar1)->super_SpecificSymbol).super_TripleSymbol.super_SleighSymbol.
          _vptr_SleighSymbol[10])(*ppOVar1,s,walker);
      }
      else {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->printpiece,(long)local_2c);
        std::operator<<(s,(string *)pvVar4);
      }
    }
  }
  return;
}

Assistant:

void Constructor::printBody(ostream &s,ParserWalker &walker) const

{
  if (flowthruindex != -1) {
    SubtableSymbol *sym = dynamic_cast<SubtableSymbol *>(operands[flowthruindex]->getDefiningSymbol());
    if (sym != (SubtableSymbol *)0) {
      walker.pushOperand(flowthruindex);
      walker.getConstructor()->printBody(s,walker);
      walker.popOperand();
      return;
    }
  }
  if (firstwhitespace == -1) return; // Nothing to print after firstwhitespace
  for(int4 i=firstwhitespace+1;i<printpiece.size();++i) {
    if (printpiece[i][0]=='\n') {
      int4 index = printpiece[i][1]-'A';
      operands[index]->print(s,walker);
    }
    else
      s << printpiece[i];
  }
}